

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

ConfigBlockSymbol * __thiscall
slang::ast::Compilation::createConfigBlock
          (Compilation *this,Scope *scope,ConfigDeclarationSyntax *syntax)

{
  SourceLocation noteLocation;
  initializer_list<const_slang::ast::ConfigBlockSymbol_*> __l;
  string_view arg;
  SyntaxNode **__x;
  bool bVar1;
  uint uVar2;
  ConfigBlockSymbol *this_00;
  long lVar3;
  equal_to<const_slang::syntax::SyntaxNode_*> *this_01;
  raw_key_type *ppSVar4;
  pointer ppVar5;
  reference ppCVar6;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *this_02;
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  *paVar7;
  pointer ppVar8;
  Diagnostic *this_03;
  size_t sVar9;
  long in_RDX;
  Scope *in_RSI;
  long in_RDI;
  Diagnostic *diag;
  borrowed_iterator_t<std::vector<const_slang::ast::ConfigBlockSymbol_*>_&> findIt;
  SourceLibrary *configLib;
  iterator it;
  ConfigRuleSyntax *ruleSyntax;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *__range2;
  ConfigBlockSymbol *config;
  size_t hash_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  SyntaxNode **k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  locator loc;
  size_t pos0;
  size_t hash;
  SyntaxNode **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x;
  locator loc_2;
  size_t pos0_2;
  size_t hash_3;
  basic_string_view<char,_std::char_traits<char>_> *k_2;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff8c8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *in_stack_fffffffffffff8d0;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff8e0;
  DiagCode DVar10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff8e8;
  raw_key_type *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  *in_stack_fffffffffffff900;
  iterator in_stack_fffffffffffff908;
  Diagnostic *in_stack_fffffffffffff910;
  vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  *args_2;
  size_t in_stack_fffffffffffff918;
  char *in_stack_fffffffffffff920;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *ptVar11;
  ConfigDeclarationSyntax *in_stack_fffffffffffff938;
  basic_string_view<char,_std::char_traits<char>_> *pbVar12;
  Scope *in_stack_fffffffffffff940;
  vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  *args_2_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff948;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *in_stack_fffffffffffff950;
  size_t hash_00;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *this_04;
  Scope *in_stack_fffffffffffff970;
  SourceLocation in_stack_fffffffffffff978;
  ConfigBlockSymbol *in_stack_fffffffffffff980;
  __normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
  local_5d8;
  SourceLibrary *local_5d0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_5c8;
  undefined1 local_599 [25];
  ConfigBlockSymbol *local_580 [3];
  iterator local_568;
  char_pointer local_558;
  table_element_pointer local_550;
  ConfigRuleSyntax *local_548;
  ConfigRuleSyntax *local_540;
  ConfigRuleSyntax **local_538;
  __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
  local_530;
  long local_528;
  SyntaxNode *local_520;
  ConfigBlockSymbol *local_518;
  long local_510;
  Scope *local_508;
  string_view *local_4f8;
  size_t local_4f0;
  char_pointer local_4e8;
  table_element_pointer local_4e0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_4d8;
  ConfigRuleSyntax **local_4c0;
  long local_4b8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_4b0;
  SyntaxNode **local_498;
  long local_490;
  ConfigBlockSymbol **local_488;
  basic_string_view<char,_std::char_traits<char>_> *local_480;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *local_478;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  local_470;
  string_view *local_458;
  size_t local_450;
  iterator local_448;
  size_t local_438;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *local_430;
  size_t local_428;
  uint local_41c;
  value_type *local_418;
  value_type *local_410;
  uint local_404;
  group_type *local_400;
  size_t local_3f8;
  pow2_quadratic_prober local_3f0;
  size_t local_3e0;
  size_t local_3d8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *local_3d0;
  size_t local_3c8;
  undefined1 local_3b9;
  SyntaxNode **local_3b8;
  long local_3b0;
  undefined1 local_3a1;
  ConfigRuleSyntax **local_3a0;
  long local_398;
  bool local_389 [25];
  iterator local_370;
  bool local_359 [25];
  iterator local_340;
  bool local_329;
  iterator local_328;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
  local_318;
  size_t local_300;
  size_t local_2f8;
  SourceLocation local_2f0;
  ConfigRuleSyntax **local_2e8;
  undefined1 *local_2e0;
  long local_2d8;
  uint local_2cc;
  value_type *local_2c8;
  value_type *local_2c0;
  uint local_2b4;
  group_type *local_2b0;
  size_t local_2a8;
  pow2_quadratic_prober local_2a0;
  size_t local_290;
  size_t local_288;
  SourceLocation local_280;
  long local_278;
  bool local_269 [25];
  iterator local_250;
  bool local_239 [25];
  iterator local_220;
  bool local_209;
  iterator local_208;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
  local_1f8;
  size_t local_1e0;
  size_t local_1d8;
  SyntaxNode **local_1d0;
  SyntaxNode **local_1c8;
  undefined1 *local_1c0;
  long local_1b8;
  uint local_1ac;
  value_type *local_1a8;
  value_type *local_1a0;
  uint local_194;
  group_type *local_190;
  size_t local_188;
  pow2_quadratic_prober local_180;
  size_t local_170;
  size_t local_168;
  SyntaxNode **local_160;
  long local_158;
  undefined1 local_149;
  vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  local_148;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  local_b0;
  size_t local_98;
  size_t local_90;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  ConfigBlockSymbol **local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  undefined1 *local_70;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  *local_8;
  
  local_510 = in_RDX;
  local_508 = in_RSI;
  this_00 = ConfigBlockSymbol::fromSyntax(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  lVar3 = in_RDI + 0xb10;
  local_518 = this_00;
  local_520 = Symbol::getSyntax(&this_00->super_Symbol);
  local_498 = &local_520;
  local_1c0 = &local_3b9;
  local_490 = lVar3;
  local_3b8 = local_498;
  local_3b0 = lVar3;
  local_1c8 = local_498;
  local_1b8 = lVar3;
  local_1d0 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
              ::key_from<slang::syntax::SyntaxNode_const*>(local_498);
  local_1d8 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
              ::hash_for<slang::syntax::SyntaxNode_const*>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                          *)in_stack_fffffffffffff8d0,(SyntaxNode **)in_stack_fffffffffffff8c8);
  local_1e0 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                              *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
  local_160 = local_1d0;
  local_170 = local_1d8;
  local_168 = local_1e0;
  local_158 = lVar3;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_180,local_1e0);
  do {
    local_188 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_180);
    local_190 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                          *)0x344175);
    local_190 = local_190 + local_188;
    local_194 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                           (size_t)in_stack_fffffffffffff8d0);
    if (local_194 != 0) {
      local_1a0 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                              *)0x3441c3);
      local_1a8 = local_1a0 + local_188 * 0xf;
      do {
        local_1ac = boost::unordered::detail::foa::unchecked_countr_zero(0);
        this_01 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                          *)0x344216);
        __x = local_160;
        ppSVar4 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                  ::
                  key_from<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>
                            ((pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>
                              *)0x344249);
        bVar1 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()(this_01,__x,ppSVar4);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
          ::table_locator(&local_1f8,local_190,local_1ac,local_1a8 + local_1ac);
          goto LAB_00344346;
        }
        local_194 = local_194 - 1 & local_194;
      } while (local_194 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
    if (bVar1) {
      memset(&local_1f8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
      ::table_locator(&local_1f8);
      goto LAB_00344346;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_180,*(size_t *)(in_RDI + 0xb18));
  } while (bVar1);
  memset(&local_1f8,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
  ::table_locator(&local_1f8);
LAB_00344346:
  bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_1f8);
  if (bVar1) {
    local_208 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                ::make_iterator((locator *)0x344366);
    local_209 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_4b0,&local_208,&local_209);
  }
  else if (*(ulong *)(in_RDI + 0xb38) < *(ulong *)(in_RDI + 0xb30)) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (in_stack_fffffffffffff900,
               CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (size_t)in_stack_fffffffffffff8f0,(try_emplace_args_t *)in_stack_fffffffffffff8e8,
               (SyntaxNode **)in_stack_fffffffffffff8e0);
    local_220 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                ::make_iterator((locator *)0x3443f4);
    local_239[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_4b0,&local_220,local_239);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                *)in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948,
               (try_emplace_args_t *)in_stack_fffffffffffff940,
               (SyntaxNode **)in_stack_fffffffffffff938);
    local_250 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                ::make_iterator((locator *)0x344465);
    local_269[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_4b0,&local_250,local_269);
  }
  ppVar5 = boost::unordered::detail::foa::
           table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
           ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)0x3444a7);
  ppVar5->second = this_00;
  local_528 = local_510 + 0x110;
  local_530._M_current =
       (ConfigRuleSyntax **)
       std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffff8c8);
  local_538 = (ConfigRuleSyntax **)
              std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>::end
                        ((span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL> *)
                         CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
  while (bVar1 = __gnu_cxx::
                 operator==<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffff8d0,
                            (__normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffff8c8), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppCVar6 = __gnu_cxx::
              __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_530);
    local_548 = *ppCVar6;
    lVar3 = in_RDI + 0xb10;
    local_4c0 = &local_548;
    local_2e0 = &local_3a1;
    in_stack_fffffffffffff980 = local_518;
    local_540 = local_548;
    local_4b8 = lVar3;
    local_3a0 = local_4c0;
    local_398 = lVar3;
    local_2e8 = local_4c0;
    local_2d8 = lVar3;
    local_2f0 = (SourceLocation)
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                ::key_from<slang::syntax::SyntaxNode_const*>(local_4c0);
    local_2f8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                ::hash_for<slang::syntax::SyntaxNode_const*>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                            *)in_stack_fffffffffffff8d0,(SyntaxNode **)in_stack_fffffffffffff8c8);
    local_300 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                                *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
    local_280 = local_2f0;
    local_290 = local_2f8;
    local_288 = local_300;
    local_278 = lVar3;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_2a0,local_300);
    do {
      local_2a8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_2a0);
      local_2b0 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                            *)0x3446b2);
      local_2b0 = local_2b0 + local_2a8;
      local_2b4 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                             (size_t)in_stack_fffffffffffff8d0);
      if (local_2b4 != 0) {
        local_2c0 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                    ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                                *)0x344700);
        local_2c8 = local_2c0 + local_2a8 * 0xf;
        do {
          local_2cc = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffff970 =
               (Scope *)boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                                *)0x344753);
          in_stack_fffffffffffff978 = local_280;
          ppSVar4 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                    ::
                    key_from<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>
                              ((pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>
                                *)0x344786);
          bVar1 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                            ((equal_to<const_slang::syntax::SyntaxNode_*> *)
                             in_stack_fffffffffffff970,(SyntaxNode **)in_stack_fffffffffffff978,
                             ppSVar4);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
            ::table_locator(&local_318,local_2b0,local_2cc,local_2c8 + local_2cc);
            goto LAB_00344883;
          }
          local_2b4 = local_2b4 - 1 & local_2b4;
        } while (local_2b4 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
      if (bVar1) {
        memset(&local_318,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
        ::table_locator(&local_318);
        goto LAB_00344883;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_2a0,*(size_t *)(in_RDI + 0xb18));
    } while (bVar1);
    memset(&local_318,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
    ::table_locator(&local_318);
LAB_00344883:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_318);
    if (bVar1) {
      local_328 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  ::make_iterator((locator *)0x3448a3);
      local_329 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_4d8,&local_328,&local_329);
    }
    else if (*(ulong *)(in_RDI + 0xb38) < *(ulong *)(in_RDI + 0xb30)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (in_stack_fffffffffffff900,
                 CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                 (size_t)in_stack_fffffffffffff8f0,(try_emplace_args_t *)in_stack_fffffffffffff8e8,
                 (SyntaxNode **)in_stack_fffffffffffff8e0);
      local_340 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  ::make_iterator((locator *)0x344931);
      local_359[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_4d8,&local_340,local_359);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  *)in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948,
                 (try_emplace_args_t *)in_stack_fffffffffffff940,
                 (SyntaxNode **)in_stack_fffffffffffff938);
      local_370 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  ::make_iterator((locator *)0x3449a2);
      local_389[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_4d8,&local_370,local_389);
    }
    ppVar5 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)0x3449e4);
    ppVar5->second = in_stack_fffffffffffff980;
    __gnu_cxx::
    __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_530);
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    (&(local_518->super_Symbol).name);
  if (!bVar1) {
    sVar9 = in_RDI + 0xae0;
    local_4f8 = &(local_518->super_Symbol).name;
    local_4f0 = sVar9;
    local_458 = local_4f8;
    local_450 = sVar9;
    local_430 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                 *)local_4f8;
    local_428 = sVar9;
    local_438 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    this_04 = local_430;
    local_3d8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                ::position_for(in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
    local_3e0 = local_438;
    hash_00 = sVar9;
    local_3d0 = this_04;
    local_3c8 = sVar9;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_3f0,local_3d8);
    do {
      local_3f8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_3f0);
      local_400 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                  ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                            *)0x344b52);
      local_400 = local_400 + local_3f8;
      local_404 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                             (size_t)in_stack_fffffffffffff8d0);
      if (local_404 != 0) {
        local_410 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                    ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                                *)0x344ba0);
        local_418 = local_410 + local_3f8 * 0xf;
        do {
          local_41c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffff948 =
               (basic_string_view<char,_std::char_traits<char>_> *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                       *)0x344bf3);
          in_stack_fffffffffffff950 = local_3d0;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                      *)0x344c26);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                             in_stack_fffffffffffff8e0);
          DVar10 = SUB84((ulong)in_stack_fffffffffffff980 >> 0x20,0);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
            ::table_locator(&local_470,local_400,local_41c,local_418 + local_41c);
            goto LAB_00344d23;
          }
          local_404 = local_404 - 1 & local_404;
        } while (local_404 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
      DVar10 = SUB84((ulong)in_stack_fffffffffffff980 >> 0x20,0);
      if (bVar1) {
        memset(&local_470,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
        ::table_locator(&local_470);
        goto LAB_00344d23;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_3f0,*(size_t *)(sVar9 + 8));
      DVar10 = SUB84((ulong)in_stack_fffffffffffff980 >> 0x20,0);
    } while (bVar1);
    memset(&local_470,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
    ::table_locator(&local_470);
LAB_00344d23:
    local_448 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                ::make_iterator((locator *)0x344d30);
    local_4e8 = local_448.pc_;
    local_4e0 = local_448.p_;
    local_558 = local_448.pc_;
    local_550 = local_448.p_;
    local_568 = boost::unordered::
                unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                       *)0x344d94);
    bVar1 = boost::unordered::detail::foa::operator==
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff8d0,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff8c8);
    if (bVar1) {
      this_02 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                 *)(in_RDI + 0xae0);
      pbVar12 = &(local_518->super_Symbol).name;
      local_599._1_8_ = local_518;
      local_599._9_8_ = local_599 + 1;
      local_599._17_8_ = 1;
      args_2_00 = (vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                   *)local_599;
      std::allocator<const_slang::ast::ConfigBlockSymbol_*>::allocator
                ((allocator<const_slang::ast::ConfigBlockSymbol_*> *)0x344e1f);
      __l._M_len = (size_type)in_stack_fffffffffffff910;
      __l._M_array = in_stack_fffffffffffff908;
      std::
      vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ::vector((vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                *)in_stack_fffffffffffff900,__l,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      local_488 = local_580;
      local_480 = pbVar12;
      local_478 = this_02;
      local_148.
      super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_488;
      local_148.
      super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pbVar12;
      local_130 = this_02;
      paVar7 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
               ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                     *)0x344eaf);
      args_2 = &local_148;
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
      ::alloc_cted_or_fwded_key_type
                ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                  *)args_2,paVar7,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 local_148.
                 super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_78 = boost::unordered::detail::foa::
                 alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                 ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                                *)args_2);
      local_70 = &local_149;
      local_80 = local_148.
                 super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_68 = this_02;
      local_88 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                 ::
                 key_from<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                           (local_78,local_148.
                                     super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
      local_90 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                 ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      local_98 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                 ::position_for(in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
      local_10 = local_88;
      local_20 = local_90;
      ptVar11 = this_02;
      local_18 = local_98;
      local_8 = this_02;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_98);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                   ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                             *)0x345002);
        local_40 = local_40 + local_38;
        uVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                           (size_t)in_stack_fffffffffffff8d0);
        local_44 = uVar2;
        if (uVar2 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                     ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                                 *)0x345057);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffff8e0 =
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                         *)0x3450a7);
            in_stack_fffffffffffff8e8 = local_10;
            in_stack_fffffffffffff8f0 =
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                 ::
                 key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>
                           ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                             *)0x3450d5);
            bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                               in_stack_fffffffffffff8e0);
            if (bVar1) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_003451dc;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        in_stack_fffffffffffff8df =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
        if ((bool)in_stack_fffffffffffff8df) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
          ::table_locator(&local_b0);
          goto LAB_003451dc;
        }
        bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,(this_02->arrays).groups_size_mask);
      } while (bVar1);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
      ::table_locator(&local_b0);
LAB_003451dc:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_b0);
      if (bVar1) {
        local_c0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                   ::make_iterator((locator *)0x3451fc);
        local_c1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_5c8,&local_c0,&local_c1);
      }
      else if ((ptVar11->size_ctrl).size < (ptVar11->size_ctrl).ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                  (this_02,CONCAT44(uVar2,in_stack_fffffffffffff8f8),
                   (size_t)in_stack_fffffffffffff8f0,(try_emplace_args_t *)in_stack_fffffffffffff8e8
                   ,in_stack_fffffffffffff8e0,args_2);
        local_d8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                   ::make_iterator((locator *)0x345298);
        local_f1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_5c8,&local_d8,local_f1);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                  (this_04,hash_00,(try_emplace_args_t *)in_stack_fffffffffffff950,
                   in_stack_fffffffffffff948,args_2_00);
        local_108 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                    ::make_iterator((locator *)0x345310);
        local_121[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_5c8,&local_108,local_121);
      }
      std::
      vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ::~vector((vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                 *)in_stack_fffffffffffff8e0);
      std::allocator<const_slang::ast::ConfigBlockSymbol_*>::~allocator
                ((allocator<const_slang::ast::ConfigBlockSymbol_*> *)local_599);
    }
    else {
      Scope::asSymbol(local_508);
      local_5d0 = Symbol::getSourceLibrary
                            ((Symbol *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8)
                            );
      ppVar8 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)in_stack_fffffffffffff8d0);
      local_5d8._M_current =
           (ConfigBlockSymbol **)
           std::ranges::__find_if_fn::
           operator()<std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:995:60)>
                     ((__find_if_fn *)&std::ranges::find_if,&ppVar8->second,&local_5d0);
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)in_stack_fffffffffffff8d0);
      std::
      vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ::end((vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
             *)in_stack_fffffffffffff8c8);
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                        ((__normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                          *)in_stack_fffffffffffff8d0,
                         (__normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                          *)in_stack_fffffffffffff8c8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffff8d0);
        std::
        vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>
        ::emplace_back<slang::ast::ConfigBlockSymbol*>
                  ((vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                    *)in_stack_fffffffffffff8e0,
                   (ConfigBlockSymbol **)
                   CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
      }
      else {
        this_03 = Scope::addDiag(in_stack_fffffffffffff970,DVar10,in_stack_fffffffffffff978);
        DVar10 = SUB84((ulong)in_stack_fffffffffffff8e0 >> 0x20,0);
        arg._M_str = in_stack_fffffffffffff920;
        arg._M_len = in_stack_fffffffffffff918;
        Diagnostic::operator<<(in_stack_fffffffffffff910,arg);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
        ::operator*(&local_5d8);
        noteLocation._7_1_ = in_stack_fffffffffffff8df;
        noteLocation._0_7_ = in_stack_fffffffffffff8d8;
        Diagnostic::addNote(this_03,DVar10,noteLocation);
      }
    }
  }
  return local_518;
}

Assistant:

const ConfigBlockSymbol& Compilation::createConfigBlock(const Scope& scope,
                                                        const ConfigDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto& config = ConfigBlockSymbol::fromSyntax(scope, syntax);

    // Register lookups by syntax node. Note that we register rule entries here
    // by looking directly at the syntax so that we don't trigger resolution
    // of the config block early, which could cause spurious errors.
    configBySyntax[config.getSyntax()] = &config;
    for (auto ruleSyntax : syntax.rules)
        configBySyntax[ruleSyntax] = &config;

    if (!config.name.empty()) {
        auto it = configBlocks.find(config.name);
        if (it == configBlocks.end()) {
            configBlocks.emplace(config.name, std::vector<const ConfigBlockSymbol*>{&config});
        }
        else {
            auto configLib = scope.asSymbol().getSourceLibrary();
            auto findIt = std::ranges::find_if(it->second, [&](const ConfigBlockSymbol* elem) {
                return elem->getSourceLibrary() == configLib;
            });

            if (findIt != it->second.end()) {
                auto& diag = scope.addDiag(diag::Redefinition, config.location);
                diag << config.name;
                diag.addNote(diag::NotePreviousDefinition, (*findIt)->location);
            }
            else {
                it->second.emplace_back(&config);
            }
        }
    }

    return config;
}